

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  string *this;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  undefined1 local_60 [8];
  FilePath output_name;
  FilePath result;
  
  if (FLAGS_gtest_output_abi_cxx11_ == (char *)0x0) {
    std::__cxx11::string::string((string *)in_RDI,"",(allocator *)local_60);
  }
  else {
    pcVar1 = strchr(FLAGS_gtest_output_abi_cxx11_,0x3a);
    if (pcVar1 == (char *)0x0) {
      UnitTest::GetInstance();
      std::__cxx11::string::string
                ((string *)&local_80,
                 ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                 _M_dataplus._M_p,(allocator *)&local_e0);
      FilePath::FilePath((FilePath *)((long)&output_name.pathname_.field_2 + 8),&local_80);
      std::__cxx11::string::string
                ((string *)&local_c0,"test_detail.xml",
                 (allocator *)(result.pathname_.field_2._M_local_buf + 0xf));
      FilePath::FilePath((FilePath *)&local_a0,&local_c0);
      FilePath::ConcatPaths
                ((FilePath *)local_60,(FilePath *)((long)&output_name.pathname_.field_2 + 8),
                 (FilePath *)&local_a0);
      std::__cxx11::string::string((string *)in_RDI,(string *)local_60);
      std::__cxx11::string::~string((string *)local_60);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)(output_name.pathname_.field_2._M_local_buf + 8));
      this = &local_80;
    }
    else {
      std::__cxx11::string::string
                ((string *)(output_name.pathname_.field_2._M_local_buf + 8),pcVar1 + 1,
                 (allocator *)&local_80);
      FilePath::FilePath((FilePath *)local_60,(string *)((long)&output_name.pathname_.field_2 + 8));
      std::__cxx11::string::~string((string *)(output_name.pathname_.field_2._M_local_buf + 8));
      if (*(char *)local_60 != '/') {
        UnitTest::GetInstance();
        std::__cxx11::string::string
                  ((string *)&local_a0,
                   ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                   _M_dataplus._M_p,(allocator *)(result.pathname_.field_2._M_local_buf + 0xf));
        FilePath::FilePath((FilePath *)&local_80,&local_a0);
        std::__cxx11::string::string
                  ((string *)&local_e0,pcVar1 + 1,
                   (allocator *)(result.pathname_.field_2._M_local_buf + 0xe));
        FilePath::FilePath((FilePath *)&local_c0,&local_e0);
        FilePath::ConcatPaths
                  ((FilePath *)((long)&output_name.pathname_.field_2 + 8),(FilePath *)&local_80,
                   (FilePath *)&local_c0);
        std::__cxx11::string::_M_assign((string *)local_60);
        std::__cxx11::string::~string((string *)(output_name.pathname_.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
      }
      if ((output_name.pathname_._M_dataplus._M_p == (pointer)0x0) ||
         (((char *)((long)local_60 + -1))[(long)output_name.pathname_._M_dataplus._M_p] != '/')) {
        std::__cxx11::string::string((string *)in_RDI,(string *)local_60);
      }
      else {
        GetCurrentExecutableName();
        GetOutputFormat_abi_cxx11_();
        FilePath::GenerateUniqueFileName
                  ((FilePath *)((long)&output_name.pathname_.field_2 + 8),(FilePath *)local_60,
                   (FilePath *)&local_80,local_a0._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::string
                  ((string *)in_RDI,(string *)(output_name.pathname_.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(output_name.pathname_.field_2._M_local_buf + 8));
      }
      this = (string *)local_60;
    }
    std::__cxx11::string::~string((string *)this);
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL)
    return "";

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == NULL)
    return internal::FilePath::ConcatPaths(
        internal::FilePath(
            UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(kDefaultOutputFile)).string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    // TODO(wan@google.com): on Windows \some\path is not an absolute
    // path (as its meaning depends on the current drive), yet the
    // following logic for turning it into an absolute path is wrong.
    // Fix it.
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}